

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  string *psVar2;
  FieldGenerator *pFVar3;
  Iterator IVar4;
  Iterator IVar5;
  string local_160;
  string local_140;
  string local_120;
  value_type local_100;
  value_type field;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  Formatter format;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  __range3._4_4_ = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
  IVar4 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
  __begin3._0_8_ = IVar4.descriptor;
  __end3.descriptor._0_4_ = IVar4.idx;
  IVar4 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
  __end3._0_8_ = IVar4.descriptor;
  oneof._0_4_ = IVar4.idx;
  while (bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof), bVar1) {
    format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
    Formatter::Formatter((Formatter *)local_90,pPStack_18,&this->variables_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"oneofname",&local_b1);
    psVar2 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)
                        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Formatter::Set<std::__cxx11::string>((Formatter *)local_90,&local_b0,psVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    Formatter::operator()<>
              ((Formatter *)local_90,
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    Formatter::Indent((Formatter *)local_90);
    Formatter::operator()<>((Formatter *)local_90,"switch ($oneofname$_case()) {\n");
    Formatter::Indent((Formatter *)local_90);
    __begin4.descriptor =
         (OneofDescriptor *)
         FieldRange<google::protobuf::OneofDescriptor>
                   ((OneofDescriptor *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                   );
    IVar5 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __begin4._0_8_ = IVar5.descriptor;
    __end4.descriptor._0_4_ = IVar5.idx;
    IVar5 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                      ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
    __end4._0_8_ = IVar5.descriptor;
    field._0_4_ = IVar5.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&field), bVar1) {
      local_100 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                            ((Iterator *)&__end4.descriptor);
      psVar2 = FieldDescriptor::name_abi_cxx11_(local_100);
      UnderscoresToCamelCase(&local_120,psVar2,true);
      Formatter::operator()((Formatter *)local_90,"case k$1$: {\n",&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      Formatter::Indent((Formatter *)local_90);
      bVar1 = IsStringOrMessage(local_100);
      if ((!bVar1) || (bVar1 = IsFieldStripped(local_100,&this->options_), bVar1)) {
        Formatter::operator()<>((Formatter *)local_90,"// No need to clear\n");
      }
      else {
        pFVar3 = FieldGeneratorMap::get(&this->field_generators_,local_100);
        (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,pPStack_18);
      }
      Formatter::operator()<>((Formatter *)local_90,"break;\n");
      Formatter::Outdent((Formatter *)local_90);
      Formatter::operator()<>((Formatter *)local_90,"}\n");
      FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                ((Iterator *)&__end4.descriptor);
    }
    psVar2 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)
                        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ToUpper(&local_140,psVar2);
    Formatter::operator()((Formatter *)local_90,"case $1$_NOT_SET: {\n  break;\n}\n",&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    Formatter::Outdent((Formatter *)local_90);
    psVar2 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)
                        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ToUpper(&local_160,psVar2);
    Formatter::operator()
              ((Formatter *)local_90,"}\n_oneof_case_[$1$] = $2$_NOT_SET;\n",
               (int *)((long)&__range3 + 4),&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    Formatter::Outdent((Formatter *)local_90);
    Formatter::operator()<>((Formatter *)local_90,"}\n\n");
    __range3._4_4_ = __range3._4_4_ + 1;
    Formatter::~Formatter((Formatter *)local_90);
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* printer) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(printer, variables_);
    format.Set("oneofname", oneof->name());

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field) || IsFieldStripped(field, options_)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "_oneof_case_[$1$] = $2$_NOT_SET;\n",
        i, ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    i++;
  }
}